

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

char * duckdb_get_varchar(duckdb_value value)

{
  size_t __n;
  string *psVar1;
  char *__dest;
  LogicalType local_70;
  Value str_val;
  
  duckdb::LogicalType::LogicalType(&local_70,VARCHAR);
  duckdb::Value::DefaultCastAs(&str_val,(Value *)value,&local_70,false);
  duckdb::LogicalType::~LogicalType(&local_70);
  psVar1 = duckdb::StringValue::Get_abi_cxx11_(&str_val);
  __n = psVar1->_M_string_length;
  __dest = (char *)malloc(__n + 1);
  switchD_00917c1c::default(__dest,(psVar1->_M_dataplus)._M_p,__n);
  __dest[__n] = '\0';
  duckdb::Value::~Value(&str_val);
  return __dest;
}

Assistant:

char *duckdb_get_varchar(duckdb_value value) {
	auto val = reinterpret_cast<duckdb::Value *>(value);
	auto str_val = val->DefaultCastAs(duckdb::LogicalType::VARCHAR);
	auto &str = duckdb::StringValue::Get(str_val);

	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (str.size() + 1)));
	memcpy(result, str.c_str(), str.size());
	result[str.size()] = '\0';
	return result;
}